

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O2

int luabridge::detail::
    Invoke<void,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<char_const*,void>>,1>
    ::run<void(*)(char_const*,char_const*)>(lua_State *L,_func_void_char_ptr_char_ptr **fn)

{
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>,_1>
  args;
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>,_1>
  local_28;
  
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>,_1>
  ::ArgList(&local_28,L);
  (**fn)(local_28.
         super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>_>
         .hd,local_28.
             super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>_>
             .tl.hd);
  return 0;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            FuncTraits<Fn>::call(fn, args);
            return 0;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }